

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Clasp::StatisticObject>
               (StatisticObject *first,StatisticObject *last,StatisticObject *x)

{
  uint64 uVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      uVar1 = x->handle_;
      first->handle_ = uVar1;
      first = first + 1;
LAB_0016eead:
      first->handle_ = uVar1;
      first = first + 1;
switchD_0016ee88_caseD_6:
      uVar1 = x->handle_;
      first->handle_ = uVar1;
      first = first + 1;
LAB_0016eebe:
      first->handle_ = uVar1;
      first = first + 1;
switchD_0016ee88_caseD_4:
      uVar1 = x->handle_;
      first->handle_ = uVar1;
      first = first + 1;
LAB_0016eecf:
      first->handle_ = uVar1;
      first = first + 1;
switchD_0016ee88_caseD_2:
      uVar1 = x->handle_;
      first->handle_ = uVar1;
      first = first + 1;
LAB_0016eee0:
      first->handle_ = uVar1;
    }
    break;
  case 1:
    uVar1 = x->handle_;
    goto LAB_0016eee0;
  case 2:
    goto switchD_0016ee88_caseD_2;
  case 3:
    uVar1 = x->handle_;
    goto LAB_0016eecf;
  case 4:
    goto switchD_0016ee88_caseD_4;
  case 5:
    uVar1 = x->handle_;
    goto LAB_0016eebe;
  case 6:
    goto switchD_0016ee88_caseD_6;
  case 7:
    uVar1 = x->handle_;
    goto LAB_0016eead;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}